

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_io.c
# Opt level: O0

void cfg_io_remove(cfg_instance *instance,cfg_io *io)

{
  bool bVar1;
  cfg_io *io_local;
  cfg_instance *instance_local;
  
  bVar1 = false;
  if ((io->node).list.next != (list_entity *)0x0) {
    bVar1 = (io->node).list.prev != (list_entity *)0x0;
  }
  if (bVar1) {
    avl_remove(&instance->io_tree,&io->node);
    (io->node).key = (void *)0x0;
  }
  return;
}

Assistant:

void
cfg_io_remove(struct cfg_instance *instance, struct cfg_io *io) {
  if (avl_is_node_added(&io->node)) {
    avl_remove(&instance->io_tree, &io->node);
    io->node.key = NULL;
  }
}